

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBHub.cpp
# Opt level: O2

void __thiscall ADSBHubConnection::Main(ADSBHubConnection *this)

{
  SOCKET *__pipedes;
  string *__rhs;
  char cVar1;
  size_type sVar2;
  bool bVar3;
  uint __i;
  int iVar4;
  int iVar5;
  ulong num;
  rep rVar6;
  NetRuntimeError *pNVar7;
  FormatTy FVar8;
  long lVar9;
  size_t __n;
  uint8_t *buffer;
  fd_set *pfVar10;
  FDDynamicData *pFVar11;
  int __flags;
  char *pcVar12;
  int iVar13;
  byte bVar14;
  allocator<char> local_293;
  allocator<char> local_292;
  allocator<char> local_291;
  string local_290;
  char *local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  ThreadSettings TS;
  timeval timeout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string local_1e8;
  fd_set sRead;
  timeval *__timeout;
  
  bVar14 = 0;
  ThreadSettings::ThreadSettings(&TS,"LT_ADSBHub",0x1fbf,"C");
  this->eFormat = FMT_UNKNOWN;
  (this->lnLeftOver)._M_string_length = 0;
  *(this->lnLeftOver)._M_dataplus._M_p = '\0';
  LTFlightData::FDKeyTy::clear(&this->fdKey);
  sRead.fds_bits[0] = (__fd_mask)(sRead.fds_bits + 2);
  sRead.fds_bits[1] = 0;
  sRead.fds_bits[2]._0_1_ = 0;
  sRead.fds_bits[4] = (__fd_mask)(sRead.fds_bits + 6);
  sRead.fds_bits[5] = 0;
  sRead.fds_bits[6]._0_1_ = 0;
  sRead.fds_bits[8] = (__fd_mask)(sRead.fds_bits + 10);
  sRead.fds_bits[9] = 0;
  sRead.fds_bits[10]._0_1_ = 0;
  sRead.fds_bits[0xc] = (__fd_mask)(sRead.fds_bits + 0xe);
  sRead.fds_bits[0xd] = 0;
  sRead.fds_bits[0xe]._0_1_ = 0;
  LTFlightData::FDStaticData::operator=(&this->stat,(FDStaticData *)&sRead);
  LTFlightData::FDStaticData::~FDStaticData((FDStaticData *)&sRead);
  LTFlightData::FDDynamicData::FDDynamicData((FDDynamicData *)&sRead);
  pfVar10 = &sRead;
  pFVar11 = &this->dyn;
  for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pFVar11->radar).size = pfVar10->fds_bits[0];
    pfVar10 = (fd_set *)((long)pfVar10 + ((ulong)bVar14 * -2 + 1) * 8);
    pFVar11 = (FDDynamicData *)((long)pFVar11 + (ulong)bVar14 * -0x10 + 8);
  }
  (this->pos)._lat = NAN;
  (this->pos)._lon = NAN;
  (this->pos)._alt = NAN;
  (this->pos)._ts = NAN;
  (this->pos)._head = NAN;
  (this->pos)._pitch = NAN;
  (this->pos)._roll = NAN;
  (this->pos).mergeCount = 1;
  (this->pos).f = (posFlagsTy)0x0;
  (this->pos).edgeIdx = 0xffffffffffffffff;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sRead,"data.adsbhub.org",(allocator<char> *)&local_290);
  XPMP2::SocketNetworking::Connect
            (&(this->tcpStream).super_SocketNetworking,(string *)&sRead,0x138a,0x2000,60000);
  std::__cxx11::string::~string((string *)&sRead);
  iVar13 = (this->tcpStream).super_SocketNetworking.f_socket;
  __pipedes = this->streamPipe;
  iVar4 = pipe(__pipedes);
  if (iVar4 < 0) {
    pNVar7 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sRead,"Couldn\'t create pipe",(allocator<char> *)&local_290);
    XPMP2::NetRuntimeError::NetRuntimeError(pNVar7,(string *)&sRead);
    __cxa_throw(pNVar7,&XPMP2::NetRuntimeError::typeinfo,XPMP2::NetRuntimeError::~NetRuntimeError);
  }
  fcntl(*__pipedes,4,0x800);
  iVar13 = iVar13 + 1;
  iVar4 = this->streamPipe[0] + 1;
  if (iVar4 < iVar13) {
    iVar4 = iVar13;
  }
  local_270 = "";
  do {
    do {
      iVar13 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                 _vptr_LTChannel[4])(this);
      if (((char)iVar13 == '\0') ||
         (iVar13 = (this->tcpStream).super_SocketNetworking.f_socket, iVar13 == -1)) {
LAB_0013f23b:
        for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 4) {
          iVar13 = *(int *)((long)this->streamPipe + lVar9);
          if (iVar13 != -1) {
            close(iVar13);
          }
          *(undefined4 *)((long)this->streamPipe + lVar9) = 0xffffffff;
        }
        XPMP2::TCPConnection::Close(&this->tcpStream);
        ThreadSettings::~ThreadSettings(&TS);
        return;
      }
      for (lVar9 = 0; lVar9 != 0x10; lVar9 = lVar9 + 1) {
        sRead.fds_bits[lVar9] = 0;
      }
      sRead.fds_bits[iVar13 / 0x40] = sRead.fds_bits[iVar13 / 0x40] | 1L << ((byte)iVar13 & 0x3f);
      sRead.fds_bits[*__pipedes / 0x40] =
           sRead.fds_bits[*__pipedes / 0x40] | 1L << ((byte)*__pipedes & 0x3f);
      timeout.tv_sec = 0x3c;
      timeout.tv_usec = 0;
      __n = 0;
      __timeout = (timeval *)&timeout;
      iVar13 = select(iVar4,(fd_set *)&sRead,(fd_set *)0x0,(fd_set *)0x0,__timeout);
      __flags = (int)__timeout;
      iVar5 = (*(this->super_LTFlightDataChannel).super_LTOnlineChannel.super_LTChannel.
                _vptr_LTChannel[4])(this);
      if ((char)iVar5 == '\0') goto LAB_0013f23b;
      if (iVar13 == 0) {
        pNVar7 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_290,"\'select\' ran into a timeout",
                   (allocator<char> *)&local_268);
        XPMP2::NetRuntimeError::NetRuntimeError(pNVar7,&local_290);
        __cxa_throw(pNVar7,&XPMP2::NetRuntimeError::typeinfo,
                    XPMP2::NetRuntimeError::~NetRuntimeError);
      }
      if (iVar13 == -1) {
        pNVar7 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_290,"\'select\' failed",(allocator<char> *)&local_268);
        XPMP2::NetRuntimeError::NetRuntimeError(pNVar7,&local_290);
        __cxa_throw(pNVar7,&XPMP2::NetRuntimeError::typeinfo,
                    XPMP2::NetRuntimeError::~NetRuntimeError);
      }
    } while ((iVar13 < 1) ||
            (iVar13 = (this->tcpStream).super_SocketNetworking.f_socket,
            ((ulong)sRead.fds_bits[iVar13 / 0x40] >> ((long)iVar13 % 0x40 & 0x3fU) & 1) == 0));
    num = XPMP2::SocketNetworking::recv
                    (&(this->tcpStream).super_SocketNetworking,0,(void *)0x0,__n,__flags);
    if ((long)num < 1) {
      GetPublicIPv4_abi_cxx11_();
      __rhs = &this->sPublicIPv4addr;
      std::__cxx11::string::operator=((string *)__rhs,(string *)&local_290);
      std::__cxx11::string::~string((string *)&local_290);
      this->eFormat = FMT_NULL_DATA;
      if ((int)dataRefs.iLogLevel < 4) {
        sVar2 = (this->sPublicIPv4addr)._M_string_length;
        if (sVar2 == 0) {
          local_290._M_dataplus._M_p = "";
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_268,"\nYour public IP address appears to be ",&local_291);
          std::operator+(&local_290,&local_268,__rhs);
        }
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTADSBHub.cpp"
               ,0xcc,"Main",logERR,
               "Received no data from ADSBHub. Verify \'Read Access\' configuration at ADSBHub!%s",
               local_290._M_dataplus._M_p);
        if (sVar2 != 0) {
          std::__cxx11::string::~string((string *)&local_290);
          std::__cxx11::string::~string((string *)&local_268);
        }
      }
      sVar2 = (this->sPublicIPv4addr)._M_string_length;
      if (sVar2 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_228,"\nYour public IP address appears to be ",&local_292);
        std::operator+(&local_208,&local_228,__rhs);
        local_270 = local_208._M_dataplus._M_p;
      }
      CreateMsgWindow(12.0,logERR,
                      "Received no data from ADSBHub. Verify \'Read Access\' configuration at ADSBHub!%s"
                      ,local_270);
      if (sVar2 != 0) {
        std::__cxx11::string::~string((string *)&local_208);
        std::__cxx11::string::~string((string *)&local_228);
      }
      pNVar7 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e8,
                 "Read no data from TCP socket (IP address correctly set up in ADSBHub settings?)",
                 &local_293);
      XPMP2::NetRuntimeError::NetRuntimeError(pNVar7,&local_1e8);
      __cxa_throw(pNVar7,&XPMP2::NetRuntimeError::typeinfo,XPMP2::NetRuntimeError::~NetRuntimeError)
      ;
    }
    if ((2 < num) && (this->eFormat == FMT_UNKNOWN)) {
      pcVar12 = (this->tcpStream).super_SocketNetworking.buf;
      if (pcVar12 == (char *)0x0) {
        pcVar12 = "";
      }
      iVar13 = isalpha((int)*pcVar12);
      if ((iVar13 == 0) || (iVar13 = isalpha((int)pcVar12[1]), iVar13 == 0)) {
LAB_0013ec18:
        FVar8 = FMT_ComprVRS;
      }
      else {
        cVar1 = pcVar12[2];
        iVar13 = isalpha((int)cVar1);
        FVar8 = FMT_SBS;
        if ((cVar1 != 0x2c) && (iVar13 == 0)) goto LAB_0013ec18;
      }
      this->eFormat = FVar8;
    }
    rVar6 = std::chrono::_V2::steady_clock::now();
    (this->lastData).__d.__r = rVar6;
    switch(this->eFormat) {
    case FMT_UNKNOWN:
    case FMT_NULL_DATA:
      pNVar7 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_290,"Format yet unknown, received too few data",
                 (allocator<char> *)&local_268);
      XPMP2::NetRuntimeError::NetRuntimeError(pNVar7,&local_290);
      __cxa_throw(pNVar7,&XPMP2::NetRuntimeError::typeinfo,XPMP2::NetRuntimeError::~NetRuntimeError)
      ;
    case FMT_SBS:
      pcVar12 = (this->tcpStream).super_SocketNetworking.buf;
      if (pcVar12 == (char *)0x0) {
        pcVar12 = "";
      }
      bVar3 = StreamProcessDataSBS(this,num,pcVar12);
      if (!bVar3) {
        pNVar7 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_290,"StreamProcessDataSBS failed",(allocator<char> *)&local_268)
        ;
        XPMP2::NetRuntimeError::NetRuntimeError(pNVar7,&local_290);
        __cxa_throw(pNVar7,&XPMP2::NetRuntimeError::typeinfo,
                    XPMP2::NetRuntimeError::~NetRuntimeError);
      }
      break;
    case FMT_ComprVRS:
      buffer = (uint8_t *)(this->tcpStream).super_SocketNetworking.buf;
      if (buffer == (uint8_t *)0x0) {
        buffer = "";
      }
      bVar3 = StreamProcessDataVRS(this,num,buffer);
      if (!bVar3) {
        pNVar7 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_290,"StreamProcessDataVRS failed",(allocator<char> *)&local_268)
        ;
        XPMP2::NetRuntimeError::NetRuntimeError(pNVar7,&local_290);
        __cxa_throw(pNVar7,&XPMP2::NetRuntimeError::typeinfo,
                    XPMP2::NetRuntimeError::~NetRuntimeError);
      }
    }
  } while( true );
}

Assistant:

void ADSBHubConnection::Main ()
{
    // This is a communication thread's main function, set thread's name and C locale
    ThreadSettings TS ("LT_ADSBHub", LC_ALL_MASK);

    try {
        // Clear some data so we can also cleanly restart
        eFormat = FMT_UNKNOWN;
        lnLeftOver.clear();
        fdKey.clear();
        stat = LTFlightData::FDStaticData();
        dyn = LTFlightData::FDDynamicData();
        pos = positionTy();

        // open a TCP connection to APRS.glidernet.org
        tcpStream.Connect(ADSBHUB_HOST, ADSBHUB_PORT, ADSBHUB_BUF_SIZE, unsigned(ADSBHUB_TIMEOUT_S * 1000));
        int maxSock = (int)tcpStream.getSocket() + 1;
#if APL == 1 || LIN == 1
        // the self-pipe to shut down the TCP socket gracefully
        if (pipe(streamPipe) < 0)
            throw XPMP2::NetRuntimeError("Couldn't create pipe");
        fcntl(streamPipe[0], F_SETFL, O_NONBLOCK);
        maxSock = std::max(maxSock, streamPipe[0]+1);
#endif
        
        // *** Main Loop ***
        while (shallRun() && tcpStream.isOpen())
        {
            // wait for some signal on either socket (Stream or self-pipe)
            fd_set sRead;
            FD_ZERO(&sRead);
            FD_SET(tcpStream.getSocket(), &sRead);     // check our socket
#if APL == 1 || LIN == 1
            FD_SET(streamPipe[0], &sRead);              // check the self-pipe
#endif
            struct timeval timeout = { ADSBHUB_TIMEOUT_S, 0 };
            int retval = select(maxSock, &sRead, NULL, NULL, &timeout);
            
            // short-cut if we are to shut down (return from 'select' due to closed socket)
            if (!shallRun())
                break;

            // select call failed???
            if (retval == -1)
                throw XPMP2::NetRuntimeError("'select' failed");
            else if (retval == 0)
                throw XPMP2::NetRuntimeError("'select' ran into a timeout");

            // select successful - traffic data
            if (retval > 0 && FD_ISSET(tcpStream.getSocket(), &sRead))
            {
                // read Stream data
                long rcvdBytes = tcpStream.recv();
                
                // received something?
                if (rcvdBytes > 0)
                {
                    // if not yet decided: decided on received message format (very first frame only)
                    if (!eFormat && rcvdBytes >= 3) {
                        const char* p = tcpStream.getBuf();
                        if (std::isalpha(p[0]) && std::isalpha(p[1]) &&
                            (std::isalpha(p[2]) || p[2] == ','))
                            eFormat = FMT_SBS;
                        else
                            eFormat = FMT_ComprVRS;
                    }
                    
                    // have it processed
                    lastData = std::chrono::steady_clock::now();
                    switch (eFormat) {
                        case FMT_SBS:
                            if (!StreamProcessDataSBS(size_t(rcvdBytes), tcpStream.getBuf()))
                                throw XPMP2::NetRuntimeError("StreamProcessDataSBS failed");
                            break;
                        case FMT_ComprVRS:
                            if (!StreamProcessDataVRS(size_t(rcvdBytes), (const uint8_t*)tcpStream.getBuf()))
                                throw XPMP2::NetRuntimeError("StreamProcessDataVRS failed");
                            break;
                        case FMT_NULL_DATA:
                        case FMT_UNKNOWN:
                            throw XPMP2::NetRuntimeError("Format yet unknown, received too few data");
                    }
                }
                else {
                    sPublicIPv4addr = GetPublicIPv4();
                    eFormat = FMT_NULL_DATA;
                    SHOW_MSG(logERR, "Received no data from ADSBHub. Verify 'Read Access' configuration at ADSBHub!%s",
                             sPublicIPv4addr.empty() ? "" : (std::string("\nYour public IP address appears to be ") + sPublicIPv4addr).c_str());
                    throw XPMP2::NetRuntimeError("Read no data from TCP socket (IP address correctly set up in ADSBHub settings?)");
                }
            }
        }
    }
    catch (std::runtime_error& e) {
        LOG_MSG(logERR, ERR_TCP_LISTENACCEPT, ChName(),
                ADSBHUB_HOST, std::to_string(ADSBHUB_PORT).c_str(),
                e.what());
        // Set channel to invalid
        SetValid(false,true);
    }
    
#if APL == 1 || LIN == 1
    // close the self-pipe sockets
    for (SOCKET &s: streamPipe) {
        if (s != INVALID_SOCKET) close(s);
        s = INVALID_SOCKET;
    }
#endif
    
    // make sure the socket is closed
    tcpStream.Close();
}